

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint Opcode;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,0xb,5);
  switch(uVar1) {
  case 0:
    MCInst_setOpcode(Inst,0xe4);
    Inst_local._4_4_ = Decode2RUSInstruction(Inst,Insn,Address,Decoder);
    break;
  case 1:
    MCInst_setOpcode(Inst,0xa1);
    Inst_local._4_4_ = Decode2RUSInstruction(Inst,Insn,Address,Decoder);
    break;
  case 2:
    MCInst_setOpcode(Inst,0x15);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 3:
    MCInst_setOpcode(Inst,0xe7);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 4:
    MCInst_setOpcode(Inst,0xd5);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 5:
    MCInst_setOpcode(Inst,0xd7);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 6:
    MCInst_setOpcode(Inst,0x54);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 7:
    MCInst_setOpcode(Inst,0x19);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 8:
    MCInst_setOpcode(Inst,0xb0);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 9:
    MCInst_setOpcode(Inst,0xa2);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  default:
    Inst_local._4_4_ = MCDisassembler_Fail;
    break;
  case 0x10:
    MCInst_setOpcode(Inst,0x7d);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x11:
    MCInst_setOpcode(Inst,0x7e);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x12:
    MCInst_setOpcode(Inst,0x14);
    Inst_local._4_4_ = Decode2RUSInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x13:
    MCInst_setOpcode(Inst,0xe6);
    Inst_local._4_4_ = Decode2RUSInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x14:
    MCInst_setOpcode(Inst,0xd4);
    Inst_local._4_4_ = Decode2RUSBitpInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x15:
    MCInst_setOpcode(Inst,0xd6);
    Inst_local._4_4_ = Decode2RUSBitpInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x16:
    MCInst_setOpcode(Inst,0x53);
    Inst_local._4_4_ = Decode2RUSInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x17:
    MCInst_setOpcode(Inst,0xed);
    Inst_local._4_4_ = Decode3RImmInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x18:
    MCInst_setOpcode(Inst,0xa4);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
    break;
  case 0x19:
    MCInst_setOpcode(Inst,0xa6);
    Inst_local._4_4_ = Decode3RInstruction(Inst,Insn,Address,Decoder);
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus Decode2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	// Try and decode as a 3R instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 11, 5);
	switch (Opcode) {
		case 0x0:
			MCInst_setOpcode(Inst, XCore_STW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x1:
			MCInst_setOpcode(Inst, XCore_LDW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x2:
			MCInst_setOpcode(Inst, XCore_ADD_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3:
			MCInst_setOpcode(Inst, XCore_SUB_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4:
			MCInst_setOpcode(Inst, XCore_SHL_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5:
			MCInst_setOpcode(Inst, XCore_SHR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6:
			MCInst_setOpcode(Inst, XCore_EQ_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7:
			MCInst_setOpcode(Inst, XCore_AND_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8:
			MCInst_setOpcode(Inst, XCore_OR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9:
			MCInst_setOpcode(Inst, XCore_LDW_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10:
			MCInst_setOpcode(Inst, XCore_LD16S_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11:
			MCInst_setOpcode(Inst, XCore_LD8U_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12:
			MCInst_setOpcode(Inst, XCore_ADD_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x13:
			MCInst_setOpcode(Inst, XCore_SUB_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14:
			MCInst_setOpcode(Inst, XCore_SHL_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x15:
			MCInst_setOpcode(Inst, XCore_SHR_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x16:
			MCInst_setOpcode(Inst, XCore_EQ_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x17:
			MCInst_setOpcode(Inst, XCore_TSETR_3r);
			return Decode3RImmInstruction(Inst, Insn, Address, Decoder);
		case 0x18:
			MCInst_setOpcode(Inst, XCore_LSS_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19:
			MCInst_setOpcode(Inst, XCore_LSU_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}